

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Mapping.cpp
# Opt level: O0

int __thiscall axl::io::Mapping::open(Mapping *this,char *__file,int __oflag,...)

{
  byte bVar1;
  int protection_00;
  uint __oflag_00;
  uint uVar2;
  uint64_t uVar3;
  void *pvVar4;
  uint in_ECX;
  File *in_stack_00000028;
  bool result;
  int protection;
  int shmFlags;
  void *p;
  uint64_t in_stack_ffffffffffffff98;
  StringRef *src;
  File *in_stack_ffffffffffffffa0;
  Mapping *this_00;
  uint_t in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc0;
  int iVar5;
  ulong offset;
  int local_8;
  
  close(this,(int)__file);
  __oflag_00 = 2;
  if ((in_ECX & 1) != 0) {
    __oflag_00 = 0;
  }
  protection_00 = 3;
  if ((in_ECX & 1) != 0) {
    protection_00 = 1;
  }
  if ((in_ECX & 4) == 0) {
    __oflag_00 = __oflag_00 | 0x40;
  }
  uVar2 = psx::SharedMemory::open(&this->m_sharedMemory,__file,__oflag_00,0x1b6);
  bVar1 = (byte)uVar2 & 1;
  if ((uVar2 & 1) == 0) {
    local_8 = 0;
  }
  else if ((((in_ECX & 4) != 0) ||
           (uVar3 = psx::File::getSize(in_stack_00000028), ___oflag <= uVar3)) ||
          (bVar1 = psx::File::setSize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98),
          (bool)bVar1)) {
    this_00 = &this->m_mapping;
    iVar5 = protection_00;
    offset = ___oflag;
    sl::Handle::operator_cast_to_int((Handle *)&this->m_sharedMemory);
    src = (StringRef *)0x0;
    pvVar4 = psx::Mapping::map((Mapping *)CONCAT44(__oflag_00,iVar5),
                               (void *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),(size_t)this,
                               protection_00,in_stack_ffffffffffffffb0,(int)(___oflag >> 0x20),
                               offset);
    if (pvVar4 == (void *)0x0) {
      if ((in_ECX & 4) == 0) {
        psx::SharedMemory::unlink(__file);
      }
      local_8 = 0;
    }
    else {
      if ((in_ECX & 4) == 0) {
        sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
                  ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)this_00,src);
      }
      this->m_p = pvVar4;
      this->m_size = offset;
      local_8 = (int)this->m_p;
    }
  }
  else {
    if ((in_ECX & 4) == 0) {
      psx::SharedMemory::unlink(__file);
    }
    local_8 = 0;
  }
  return local_8;
}

Assistant:

void*
Mapping::open(
	const sl::StringRef& name,
	size_t size,
	uint_t flags
) {
	ASSERT(size != -1);

	close();

	void* p;

#if (_AXL_OS_WIN)
	uint_t protection = (flags & FileFlag_ReadOnly) ? PAGE_READONLY : PAGE_READWRITE;
	uint_t access = (flags & FileFlag_ReadOnly) ? FILE_MAP_READ : FILE_MAP_READ | FILE_MAP_WRITE;

	sl::String_w name_w = name;

	bool result = (flags & FileFlag_OpenExisting) ?
		m_mapping.open(access, false, name_w):
		m_mapping.create(INVALID_HANDLE_VALUE, NULL, protection, size, name_w);

	if (!result)
		return NULL;

	p = m_view.view(m_mapping, access, 0, size);
	if (!p) {
		m_mapping.close();
		return NULL;
	}
#elif (_AXL_OS_POSIX)
	int shmFlags = (flags & FileFlag_ReadOnly) ? O_RDONLY : O_RDWR;
	int protection = (flags & FileFlag_ReadOnly) ? PROT_READ : PROT_READ | PROT_WRITE;

	if (!(flags & FileFlag_OpenExisting))
		shmFlags |= O_CREAT;

	bool result = m_sharedMemory.open(name, shmFlags, S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP | S_IROTH | S_IWOTH);
	if (!result)
		return NULL;

	if (!(flags & FileFlag_OpenExisting) && m_sharedMemory.getSize() < size) {
		result = m_sharedMemory.setSize(size);
		if (!result) {
			if (!(flags & FileFlag_OpenExisting))
				psx::SharedMemory::unlink(name);

			return NULL;
		}
	}

	p = m_mapping.map(NULL, size, protection, MAP_SHARED, m_sharedMemory, 0);
	if (!p) {
		if (!(flags & FileFlag_OpenExisting))
			psx::SharedMemory::unlink(name);

		return NULL;
	}

	if (!(flags & FileFlag_OpenExisting))
		m_sharedMemoryName = name;

#endif

	m_p = p;
	m_size = size;
	return m_p;
}